

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Console.hpp
# Opt level: O0

void __thiscall nite::Console::Result::Result(Result *this)

{
  Color local_2c;
  Result *local_10;
  Result *this_local;
  
  local_10 = this;
  std::__cxx11::string::string((string *)this);
  Color::Color(&this->color);
  std::__cxx11::string::operator=((string *)this,"");
  Color::Color(&local_2c,1.0,1.0,1.0,1.0);
  (this->color).r = local_2c.r;
  (this->color).g = local_2c.g;
  (this->color).b = local_2c.b;
  (this->color).a = local_2c.a;
  this->val = 0;
  return;
}

Assistant:

Result(){
                    msg = "";
                    color = nite::Color(1.0f, 1.0f, 1.0f, 1.0f);
                    val = 0;
                }